

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined4 uVar6;
  float fVar7;
  undefined4 uVar12;
  undefined1 auVar8 [16];
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar11 [16];
  undefined8 uVar14;
  double input;
  double approxVal;
  TEvalOpts opts;
  double local_100;
  int local_f8;
  float local_f4;
  float local_f0;
  undefined4 uStack_ec;
  double local_e8;
  undefined8 uStack_e0;
  double local_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  TEvalOpts local_88;
  
  ParseOptions(&local_88,argc,argv);
  if (local_88.NoDenormals == true) {
    local_8c = MXCSR;
    local_94 = MXCSR | 0x8000;
    MXCSR = MXCSR | 0x8040;
    local_98 = MXCSR;
    local_90 = local_94;
  }
  psVar1 = &local_88.Arch;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)psVar1), iVar2 != 0)) &&
     (iVar2 = std::__cxx11::string::compare((char *)psVar1), iVar2 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "requirement arch == \"plain\" || arch == \"avx2\" || arch == \"avx\" failed",0x45);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0010a92b:
    exit(1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_88);
  if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)&local_88), iVar2 != 0)) &&
     ((iVar2 = std::__cxx11::string::compare((char *)&local_88), iVar2 != 0 &&
      (iVar2 = std::__cxx11::string::compare((char *)&local_88), iVar2 != 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "requirement func == \"exp\" || func == \"log\" || func == \"sigm\" || func == \"tanh\" failed"
               ,0x55);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    goto LAB_0010a92b;
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  local_f8 = std::__cxx11::string::compare((char *)psVar1);
  local_e8 = (double)CONCAT44(local_e8._4_4_,local_88.Lo);
  local_f4 = local_88.Hi;
  if (local_88.Print == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"input\ttrue\tapprox",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_88);
  uVar12 = (undefined4)(local_88.N >> 0x20);
  uVar6 = (undefined4)local_88.N;
  if (iVar3 == 0) {
    if (local_88.N != 0xffffffffffffffff) {
      local_b0 = (double)local_e8._0_4_;
      local_f4 = local_f4 - local_e8._0_4_;
      auVar9._8_4_ = uVar12;
      auVar9._0_8_ = local_88.N;
      auVar9._12_4_ = 0x45300000;
      dVar13 = auVar9._8_8_ - 1.9342813113834067e+25;
      local_a8._8_4_ = SUB84(dVar13,0);
      local_a8._0_8_ = dVar13 + ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0);
      local_a8._12_4_ = (int)((ulong)dVar13 >> 0x20);
      local_d0 = 0.0;
      uVar5 = 0;
      do {
        dVar13 = (double)((float)uVar5 * local_f4) / (double)local_a8._0_8_ + local_b0;
        if (local_88.UseDouble == false) {
          local_100 = (double)CONCAT44(local_100._4_4_,(float)dVar13);
          fVar7 = expf((float)dVar13);
          local_e8 = (double)CONCAT44(local_e8._4_4_,fVar7);
          if (local_88.Exact == true) {
            if (iVar2 == 0) {
              NFastOps::ExpAvx2<true,false>((float *)&local_100,1,&local_f0);
            }
            else if (local_f8 == 0) {
              NFastOps::ExpAvx<true,false>((float *)&local_100,1,&local_f0);
            }
            else {
LAB_00109d5b:
              NFastOps::ExpPlain((float *)&local_100,1,&local_f0);
            }
          }
          else if (iVar2 == 0) {
            NFastOps::ExpAvx2<false,false>((float *)&local_100,1,&local_f0);
          }
          else {
            if (local_f8 != 0) goto LAB_00109d5b;
            NFastOps::ExpAvx<false,false>((float *)&local_100,1,&local_f0);
          }
          local_c8 = (double)local_e8._0_4_;
          uStack_c0 = 0;
          local_e8 = ABS((double)local_f0 - local_c8) / (ABS(local_c8) + 1e-100);
          uStack_e0 = 0;
          if (local_88.Print == true) {
            poVar4 = std::ostream::_M_insert<double>((double)local_100._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            poVar4 = std::ostream::_M_insert<double>(local_c8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            poVar4 = std::ostream::_M_insert<double>((double)local_f0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            poVar4 = std::ostream::_M_insert<double>(local_e8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
        }
        else {
          local_100 = dVar13;
          local_c8 = exp(dVar13);
          uStack_c0 = extraout_XMM0_Qb_00;
          if (local_88.Exact == true) {
            if (iVar2 == 0) {
              NFastOps::ExpAvx2<true,false>(&local_100,1,(double *)&local_f0);
            }
            else if (local_f8 == 0) {
              NFastOps::ExpAvx<true,false>(&local_100,1,(double *)&local_f0);
            }
            else {
LAB_00109d35:
              NFastOps::ExpPlain(&local_100,1,(double *)&local_f0);
            }
          }
          else if (iVar2 == 0) {
            NFastOps::ExpAvx2<false,false>(&local_100,1,(double *)&local_f0);
          }
          else {
            if (local_f8 != 0) goto LAB_00109d35;
            NFastOps::ExpAvx<false,false>(&local_100,1,(double *)&local_f0);
          }
          local_e8 = ABS((double)CONCAT44(uStack_ec,local_f0) - local_c8) / (ABS(local_c8) + 1e-100)
          ;
          uStack_e0 = 0;
          if (local_88.Print == true) {
            poVar4 = std::ostream::_M_insert<double>(local_100);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            poVar4 = std::ostream::_M_insert<double>(local_c8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            poVar4 = std::ostream::_M_insert<double>((double)CONCAT44(uStack_ec,local_f0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            poVar4 = std::ostream::_M_insert<double>(local_e8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
        }
        dVar13 = local_e8;
        if (local_e8 <= local_d0) {
          dVar13 = local_d0;
        }
        uVar5 = uVar5 + 1;
        uVar14 = uStack_e0;
        local_d0 = dVar13;
      } while (local_88.N + 1 != uVar5);
      goto LAB_0010a831;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar3 == 0) {
      if (local_88.N != 0xffffffffffffffff) {
        local_b0 = (double)local_e8._0_4_;
        local_f4 = local_f4 - local_e8._0_4_;
        auVar10._8_4_ = uVar12;
        auVar10._0_8_ = local_88.N;
        auVar10._12_4_ = 0x45300000;
        dVar13 = auVar10._8_8_ - 1.9342813113834067e+25;
        local_a8._8_4_ = SUB84(dVar13,0);
        local_a8._0_8_ = dVar13 + ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0);
        local_a8._12_4_ = (int)((ulong)dVar13 >> 0x20);
        local_d0 = 0.0;
        uVar5 = 0;
        do {
          dVar13 = (double)((float)uVar5 * local_f4) / (double)local_a8._0_8_ + local_b0;
          if (local_88.UseDouble == false) {
            fVar7 = expf((float)dVar13);
            local_100 = (double)CONCAT44(local_100._4_4_,fVar7);
            fVar7 = logf(fVar7);
            local_e8 = (double)CONCAT44(local_e8._4_4_,fVar7);
            if (local_88.Exact == true) {
              if (iVar2 == 0) {
                NFastOps::LogAvx2<true,false>((float *)&local_100,1,&local_f0);
              }
              else if (local_f8 == 0) {
                NFastOps::LogAvx<true,false>((float *)&local_100,1,&local_f0);
              }
              else {
LAB_0010a162:
                NFastOps::LogPlain((float *)&local_100,1,&local_f0);
              }
            }
            else if (iVar2 == 0) {
              NFastOps::LogAvx2<false,false>((float *)&local_100,1,&local_f0);
            }
            else {
              if (local_f8 != 0) goto LAB_0010a162;
              NFastOps::LogAvx<false,false>((float *)&local_100,1,&local_f0);
            }
            local_c8 = (double)local_e8._0_4_;
            uStack_c0 = 0;
            local_e8 = ABS((double)local_f0 - local_c8) / (ABS(local_c8) + 1e-100);
            uStack_e0 = 0;
            if (local_88.Print == true) {
              poVar4 = std::ostream::_M_insert<double>((double)local_100._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>(local_c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>((double)local_f0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>(local_e8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
            }
          }
          else {
            local_100 = exp(dVar13);
            local_c8 = log(local_100);
            uStack_c0 = extraout_XMM0_Qb_01;
            if (local_88.Exact == true) {
              if (iVar2 == 0) {
                NFastOps::LogAvx2<true,false>(&local_100,1,(double *)&local_f0);
              }
              else if (local_f8 == 0) {
                NFastOps::LogAvx<true,false>(&local_100,1,(double *)&local_f0);
              }
              else {
LAB_0010a13c:
                NFastOps::LogPlain(&local_100,1,(double *)&local_f0);
              }
            }
            else if (iVar2 == 0) {
              NFastOps::LogAvx2<false,false>(&local_100,1,(double *)&local_f0);
            }
            else {
              if (local_f8 != 0) goto LAB_0010a13c;
              NFastOps::LogAvx<false,false>(&local_100,1,(double *)&local_f0);
            }
            local_e8 = ABS((double)CONCAT44(uStack_ec,local_f0) - local_c8) /
                       (ABS(local_c8) + 1e-100);
            uStack_e0 = 0;
            if (local_88.Print == true) {
              poVar4 = std::ostream::_M_insert<double>(local_100);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>(local_c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>((double)CONCAT44(uStack_ec,local_f0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>(local_e8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
            }
          }
          dVar13 = local_e8;
          if (local_e8 <= local_d0) {
            dVar13 = local_d0;
          }
          uVar5 = uVar5 + 1;
          uVar14 = uStack_e0;
          local_d0 = dVar13;
        } while (local_88.N + 1 != uVar5);
        goto LAB_0010a831;
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_88);
        dVar13 = 0.0;
        uVar14 = 0;
        if (local_88.N != 0xffffffffffffffff && iVar3 == 0) {
          local_b0 = (double)local_e8._0_4_;
          local_f4 = local_f4 - local_e8._0_4_;
          auVar8._8_4_ = uVar12;
          auVar8._0_8_ = local_88.N;
          auVar8._12_4_ = 0x45300000;
          dVar13 = auVar8._8_8_ - 1.9342813113834067e+25;
          local_a8._8_4_ = SUB84(dVar13,0);
          local_a8._0_8_ = dVar13 + ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0);
          local_a8._12_4_ = (int)((ulong)dVar13 >> 0x20);
          local_d0 = 0.0;
          uVar5 = 0;
          do {
            dVar13 = (double)((float)uVar5 * local_f4) / (double)local_a8._0_8_ + local_b0;
            if (local_88.UseDouble == false) {
              local_100 = (double)CONCAT44(local_100._4_4_,(float)dVar13);
              fVar7 = tanhf((float)dVar13);
              local_e8 = (double)CONCAT44(local_e8._4_4_,fVar7);
              if (local_88.Exact == true) {
                if (iVar2 == 0) {
                  NFastOps::TanhAvx2<true,false>((float *)&local_100,1,&local_f0);
                }
                else if (local_f8 == 0) {
                  NFastOps::TanhAvx<true,false>((float *)&local_100,1,&local_f0);
                }
                else {
LAB_0010995e:
                  NFastOps::TanhPlain((float *)&local_100,1,&local_f0);
                }
              }
              else if (iVar2 == 0) {
                NFastOps::TanhAvx2<false,false>((float *)&local_100,1,&local_f0);
              }
              else {
                if (local_f8 != 0) goto LAB_0010995e;
                NFastOps::TanhAvx<false,false>((float *)&local_100,1,&local_f0);
              }
              local_c8 = (double)local_e8._0_4_;
              uStack_c0 = 0;
              local_e8 = ABS((double)local_f0 - local_c8) / (ABS(local_c8) + 1e-100);
              uStack_e0 = 0;
              if (local_88.Print == true) {
                poVar4 = std::ostream::_M_insert<double>((double)local_100._0_4_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
                poVar4 = std::ostream::_M_insert<double>(local_c8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
                poVar4 = std::ostream::_M_insert<double>((double)local_f0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
                poVar4 = std::ostream::_M_insert<double>(local_e8);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
              }
            }
            else {
              local_100 = dVar13;
              local_c8 = tanh(dVar13);
              uStack_c0 = extraout_XMM0_Qb;
              if (local_88.Exact == true) {
                if (iVar2 == 0) {
                  NFastOps::TanhAvx2<true,false>(&local_100,1,(double *)&local_f0);
                }
                else if (local_f8 == 0) {
                  NFastOps::TanhAvx<true,false>(&local_100,1,(double *)&local_f0);
                }
                else {
LAB_00109938:
                  NFastOps::TanhPlain(&local_100,1,(double *)&local_f0);
                }
              }
              else if (iVar2 == 0) {
                NFastOps::TanhAvx2<false,false>(&local_100,1,(double *)&local_f0);
              }
              else {
                if (local_f8 != 0) goto LAB_00109938;
                NFastOps::TanhAvx<false,false>(&local_100,1,(double *)&local_f0);
              }
              local_e8 = ABS((double)CONCAT44(uStack_ec,local_f0) - local_c8) /
                         (ABS(local_c8) + 1e-100);
              uStack_e0 = 0;
              if (local_88.Print == true) {
                poVar4 = std::ostream::_M_insert<double>(local_100);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
                poVar4 = std::ostream::_M_insert<double>(local_c8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
                poVar4 = std::ostream::_M_insert<double>((double)CONCAT44(uStack_ec,local_f0));
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
                poVar4 = std::ostream::_M_insert<double>(local_e8);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
              }
            }
            dVar13 = local_e8;
            if (local_e8 <= local_d0) {
              dVar13 = local_d0;
            }
            uVar5 = uVar5 + 1;
            uVar14 = uStack_e0;
            local_d0 = dVar13;
          } while (local_88.N + 1 != uVar5);
        }
        goto LAB_0010a831;
      }
      if (local_88.N != 0xffffffffffffffff) {
        local_b0 = (double)local_e8._0_4_;
        auVar11._8_4_ = uVar12;
        auVar11._0_8_ = local_88.N;
        auVar11._12_4_ = 0x45300000;
        dVar13 = auVar11._8_8_ - 1.9342813113834067e+25;
        local_f4 = local_f4 - local_e8._0_4_;
        local_a8._8_4_ = SUB84(dVar13,0);
        local_a8._0_8_ = dVar13 + ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0);
        local_a8._12_4_ = (int)((ulong)dVar13 >> 0x20);
        local_d0 = 0.0;
        uVar5 = 0;
        do {
          dVar13 = (double)((float)uVar5 * local_f4) / (double)local_a8._0_8_ + local_b0;
          if (local_88.UseDouble == false) {
            local_100 = (double)CONCAT44(local_100._4_4_,(float)dVar13);
            fVar7 = expf(-(float)dVar13);
            local_e8 = (double)CONCAT44(local_e8._4_4_,1.0 / (fVar7 + 1.0));
            if (local_88.Exact == true) {
              if (iVar2 == 0) {
                NFastOps::SigmoidAvx2<true,false>((float *)&local_100,1,&local_f0);
              }
              else if (local_f8 == 0) {
                NFastOps::SigmoidAvx<true,false>((float *)&local_100,1,&local_f0);
              }
              else {
LAB_0010a5a2:
                NFastOps::SigmoidPlain((float *)&local_100,1,&local_f0);
              }
            }
            else if (iVar2 == 0) {
              NFastOps::SigmoidAvx2<false,false>((float *)&local_100,1,&local_f0);
            }
            else {
              if (local_f8 != 0) goto LAB_0010a5a2;
              NFastOps::SigmoidAvx<false,false>((float *)&local_100,1,&local_f0);
            }
            local_c8 = (double)local_e8._0_4_;
            uStack_c0 = 0;
            local_e8 = ABS((double)local_f0 - local_c8) / (ABS(local_c8) + 1e-100);
            uStack_e0 = 0;
            if (local_88.Print == true) {
              poVar4 = std::ostream::_M_insert<double>((double)local_100._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>(local_c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>((double)local_f0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>(local_e8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
            }
          }
          else {
            local_100 = dVar13;
            dVar13 = exp(-dVar13);
            local_c8 = 1.0 / (dVar13 + 1.0);
            uStack_c0 = 0;
            if (local_88.Exact == true) {
              if (iVar2 == 0) {
                NFastOps::SigmoidAvx2<true,false>(&local_100,1,(double *)&local_f0);
              }
              else if (local_f8 == 0) {
                NFastOps::SigmoidAvx<true,false>(&local_100,1,(double *)&local_f0);
              }
              else {
LAB_0010a57c:
                NFastOps::SigmoidPlain(&local_100,1,(double *)&local_f0);
              }
            }
            else if (iVar2 == 0) {
              NFastOps::SigmoidAvx2<false,false>(&local_100,1,(double *)&local_f0);
            }
            else {
              if (local_f8 != 0) goto LAB_0010a57c;
              NFastOps::SigmoidAvx<false,false>(&local_100,1,(double *)&local_f0);
            }
            local_e8 = ABS((double)CONCAT44(uStack_ec,local_f0) - local_c8) /
                       (ABS(local_c8) + 1e-100);
            uStack_e0 = 0;
            if (local_88.Print == true) {
              poVar4 = std::ostream::_M_insert<double>(local_100);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>(local_c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>((double)CONCAT44(uStack_ec,local_f0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
              poVar4 = std::ostream::_M_insert<double>(local_e8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
            }
          }
          dVar13 = local_e8;
          if (local_e8 <= local_d0) {
            dVar13 = local_d0;
          }
          uVar5 = uVar5 + 1;
          uVar14 = uStack_e0;
          local_d0 = dVar13;
        } while (local_88.N + 1 != uVar5);
        goto LAB_0010a831;
      }
    }
  }
  dVar13 = 0.0;
  uVar14 = 0;
LAB_0010a831:
  local_e8 = dVar13;
  uStack_e0 = uVar14;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Maximum relative error: ",0x18);
  poVar4 = std::ostream::_M_insert<double>(local_e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.Arch._M_dataplus._M_p != &local_88.Arch.field_2) {
    operator_delete(local_88.Arch._M_dataplus._M_p,local_88.Arch.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.Func._M_dataplus._M_p != &local_88.Func.field_2) {
    operator_delete(local_88.Func._M_dataplus._M_p,local_88.Func.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TEvalOpts opts = ParseOptions(argc, argv);

    if (opts.NoDenormals) {
        _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
        _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);
    }

    if (!(opts.Arch == "plain" || opts.Arch == "avx2" || opts.Arch == "avx")) {
        std::cerr << "requirement arch == \"plain\" || arch == \"avx2\" || arch == \"avx\" failed" << std::endl;
        exit(1);
    }
    if (!(opts.Func == "exp" || opts.Func == "log" || opts.Func == "sigm" || opts.Func == "tanh")) {
        std::cerr << "requirement func == \"exp\" || func == \"log\" || func == \"sigm\" || func == \"tanh\" failed" << std::endl;
        exit(1);
    }

    bool isAvx2 = opts.Arch == "avx2";
    bool isAvx = opts.Arch == "avx";
    float lo = opts.Lo;
    float hi = opts.Hi;
    size_t n = opts.N;

    if (opts.Print) {
        std::cout << "input\ttrue\tapprox" << std::endl;
    }

    double maxError = 0;
    if (opts.Func == "exp") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = exp(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = exp(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "log") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                input = exp(input);
                float trueVal = log(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::LogAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::LogAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                input = exp(input);
                double trueVal = log(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::LogAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::LogAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "sigm") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = 1.0 / (1.0 + exp(-input));
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = 1.0 / (1.0 + exp(-input));
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "tanh") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = tanh(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = tanh(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    }
    std::cout << "Maximum relative error: " << maxError << std::endl;
}